

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__write(uv_stream_t *stream)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  undefined1 *puVar4;
  long lVar5;
  ulong uVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  long *plVar14;
  iovec *__iovec;
  anon_union_64_2_d657c519 scratch;
  msghdr msg;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  msghdr local_68;
  
  if (-1 < (stream->io_watcher).fd) {
    do {
      puVar4 = (undefined1 *)stream->write_queue[0];
      if (stream->write_queue == (void **)puVar4) {
        return;
      }
      if (*(uv_stream_t **)(puVar4 + -8) != stream) {
        __assert_fail("req->handle == stream",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x2fb,"void uv__write(uv_stream_t *)");
      }
      iVar13 = *(int *)(puVar4 + 0x20) - *(uint *)(puVar4 + 0x10);
      __iovec = (iovec *)((ulong)*(uint *)(puVar4 + 0x10) * 0x10 + *(long *)(puVar4 + 0x18));
      iVar8 = uv__getiovmax();
      if (iVar8 <= iVar13) {
        iVar13 = iVar8;
      }
      lVar5 = *(long *)(puVar4 + -0x10);
      if (lVar5 == 0) {
        do {
          iVar8 = (stream->io_watcher).fd;
          if (iVar13 == 1) {
            uVar9 = write(iVar8,__iovec->iov_base,__iovec->iov_len);
          }
          else {
            uVar9 = writev(iVar8,__iovec,iVar13);
          }
          if (uVar9 != 0xffffffffffffffff) goto LAB_0054bc22;
          piVar10 = __errno_location();
          iVar8 = *piVar10;
        } while (iVar8 == 4);
        uVar9 = 0xffffffffffffffff;
LAB_0054bcd0:
        if (iVar8 != 0xb) {
          *(int *)(puVar4 + 0x24) = -iVar8;
          uv__write_req_finish((uv_write_t *)(puVar4 + -0x58));
          uv__io_stop(stream->loop,&stream->io_watcher,4);
          iVar13 = uv__io_active(&stream->io_watcher,1);
          if (iVar13 != 0) {
            return;
          }
          uVar2 = stream->flags;
          if ((uVar2 >> 0xe & 1) == 0) {
            return;
          }
          stream->flags = uVar2 & 0xffffbfff;
          if ((uVar2 >> 0xd & 1) == 0) {
            return;
          }
          puVar1 = &stream->loop->active_handles;
          *puVar1 = *puVar1 - 1;
          return;
        }
        if ((stream->flags & 0x80) == 0) {
LAB_0054bd2a:
          if (1 < uVar9 + 1) {
            __assert_fail("n == 0 || n == -1",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                          ,0x394,"void uv__write(uv_stream_t *)");
          }
          cVar7 = (char)stream->flags;
LAB_0054bd3a:
          if (-1 < cVar7) {
            uv__io_start(stream->loop,&stream->io_watcher,4);
            return;
          }
          __assert_fail("!(stream->flags & UV_STREAM_BLOCKING)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                        ,0x397,"void uv__write(uv_stream_t *)");
        }
      }
      else {
        iVar8 = *(int *)(lVar5 + 0x10);
        lVar11 = 0xb8;
        if ((iVar8 != 7) && (iVar8 != 0xc)) {
          if (iVar8 != 0xf) goto LAB_0054be55;
          lVar11 = 0xb0;
        }
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        uStack_90 = 0;
        if ((int)*(uint *)(lVar5 + lVar11) < 0) {
LAB_0054be55:
          uStack_70 = 0;
          local_78 = 0;
          uStack_80 = 0;
          local_88 = 0;
          uStack_90 = 0;
          local_98 = 0;
          uStack_a0 = 0;
          local_a8 = 0;
          __assert_fail("fd_to_send >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                        ,0x31b,"void uv__write(uv_stream_t *)");
        }
        local_68.msg_name = (void *)0x0;
        local_68.msg_namelen = 0;
        local_68.msg_iovlen = (size_t)iVar13;
        local_68.msg_flags = 0;
        local_68.msg_control = &local_a8;
        local_68.msg_controllen = 0x18;
        uStack_a0 = 0x100000001;
        local_a8 = 0x14;
        local_98 = (ulong)*(uint *)(lVar5 + lVar11);
        local_68.msg_iov = __iovec;
        do {
          uVar9 = sendmsg((stream->io_watcher).fd,&local_68,0);
          if (uVar9 != 0xffffffffffffffff) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
LAB_0054bc22:
        if ((long)uVar9 < 0) {
          piVar10 = __errno_location();
          iVar8 = *piVar10;
          goto LAB_0054bcd0;
        }
        while( true ) {
          if ((long)uVar9 < 0) goto LAB_0054bd2a;
          uVar2 = *(uint *)(puVar4 + 0x10);
          uVar3 = *(uint *)(puVar4 + 0x20);
          if (uVar3 <= uVar2) {
            __assert_fail("req->write_index < req->nbufs",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                          ,0x36a,"void uv__write(uv_stream_t *)");
          }
          uVar6 = *(ulong *)(*(long *)(puVar4 + 0x18) + 8 + (ulong)uVar2 * 0x10);
          uVar12 = uVar9 - uVar6;
          if (uVar9 < uVar6) break;
          *(uint *)(puVar4 + 0x10) = uVar2 + 1;
          if (stream->write_queue_size < uVar6) {
            __assert_fail("stream->write_queue_size >= len",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                          ,0x385,"void uv__write(uv_stream_t *)");
          }
          stream->write_queue_size = stream->write_queue_size - uVar6;
          uVar9 = uVar12;
          if (uVar2 + 1 == uVar3) {
            if (uVar12 == 0) {
              uv__write_req_finish((uv_write_t *)(puVar4 + -0x58));
              return;
            }
            __assert_fail("n == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                          ,0x38a,"void uv__write(uv_stream_t *)");
          }
        }
        plVar14 = (long *)(*(long *)(puVar4 + 0x18) + (ulong)uVar2 * 0x10);
        *plVar14 = *plVar14 + uVar9;
        plVar14[1] = uVar6 - uVar9;
        stream->write_queue_size = stream->write_queue_size - uVar9;
        cVar7 = (char)stream->flags;
        if (-1 < cVar7) goto LAB_0054bd3a;
      }
    } while (-1 < (stream->io_watcher).fd);
  }
  __assert_fail("uv__stream_fd(stream) >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                ,0x2f4,"void uv__write(uv_stream_t *)");
}

Assistant:

static void uv__write(uv_stream_t* stream) {
  struct iovec* iov;
  QUEUE* q;
  uv_write_t* req;
  int iovmax;
  int iovcnt;
  ssize_t n;

start:

  assert(uv__stream_fd(stream) >= 0);

  if (QUEUE_EMPTY(&stream->write_queue))
    return;

  q = QUEUE_HEAD(&stream->write_queue);
  req = QUEUE_DATA(q, uv_write_t, queue);
  assert(req->handle == stream);

  /*
   * Cast to iovec. We had to have our own uv_buf_t instead of iovec
   * because Windows's WSABUF is not an iovec.
   */
  assert(sizeof(uv_buf_t) == sizeof(struct iovec));
  iov = (struct iovec*) &(req->bufs[req->write_index]);
  iovcnt = req->nbufs - req->write_index;

  iovmax = uv__getiovmax();

  /* Limit iov count to avoid EINVALs from writev() */
  if (iovcnt > iovmax)
    iovcnt = iovmax;

  /*
   * Now do the actual writev. Note that we've been updating the pointers
   * inside the iov each time we write. So there is no need to offset it.
   */

  if (req->send_handle) {
    struct msghdr msg;
    struct cmsghdr *cmsg;
    int fd_to_send = uv__handle_fd((uv_handle_t*) req->send_handle);
    union {
      char data[64];
      struct cmsghdr alias;
    } scratch;

    memset(&scratch, 0, sizeof(scratch));

    assert(fd_to_send >= 0);

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = iov;
    msg.msg_iovlen = iovcnt;
    msg.msg_flags = 0;

    msg.msg_control = &scratch.alias;
    msg.msg_controllen = CMSG_SPACE(sizeof(fd_to_send));

    cmsg = CMSG_FIRSTHDR(&msg);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = CMSG_LEN(sizeof(fd_to_send));

    /* silence aliasing warning */
    {
      void* pv = CMSG_DATA(cmsg);
      int* pi = pv;
      *pi = fd_to_send;
    }

    do {
      n = sendmsg(uv__stream_fd(stream), &msg, 0);
    }
#if defined(__APPLE__)
    /*
     * Due to a possible kernel bug at least in OS X 10.10 "Yosemite",
     * EPROTOTYPE can be returned while trying to write to a socket that is
     * shutting down. If we retry the write, we should get the expected EPIPE
     * instead.
     */
    while (n == -1 && (errno == EINTR || errno == EPROTOTYPE));
#else
    while (n == -1 && errno == EINTR);
#endif
  } else {
    do {
      if (iovcnt == 1) {
        n = write(uv__stream_fd(stream), iov[0].iov_base, iov[0].iov_len);
      } else {
        n = writev(uv__stream_fd(stream), iov, iovcnt);
      }
    }
#if defined(__APPLE__)
    /*
     * Due to a possible kernel bug at least in OS X 10.10 "Yosemite",
     * EPROTOTYPE can be returned while trying to write to a socket that is
     * shutting down. If we retry the write, we should get the expected EPIPE
     * instead.
     */
    while (n == -1 && (errno == EINTR || errno == EPROTOTYPE));
#else
    while (n == -1 && errno == EINTR);
#endif
  }

  if (n < 0) {
    if (errno != EAGAIN && errno != EWOULDBLOCK) {
      /* Error */
      req->error = -errno;
      uv__write_req_finish(req);
      uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
      if (!uv__io_active(&stream->io_watcher, POLLIN))
        uv__handle_stop(stream);
      uv__stream_osx_interrupt_select(stream);
      return;
    } else if (stream->flags & UV_STREAM_BLOCKING) {
      /* If this is a blocking stream, try again. */
      goto start;
    }
  } else {
    /* Successful write */

    while (n >= 0) {
      uv_buf_t* buf = &(req->bufs[req->write_index]);
      size_t len = buf->len;

      assert(req->write_index < req->nbufs);

      if ((size_t)n < len) {
        buf->base += n;
        buf->len -= n;
        stream->write_queue_size -= n;
        n = 0;

        /* There is more to write. */
        if (stream->flags & UV_STREAM_BLOCKING) {
          /*
           * If we're blocking then we should not be enabling the write
           * watcher - instead we need to try again.
           */
          goto start;
        } else {
          /* Break loop and ensure the watcher is pending. */
          break;
        }

      } else {
        /* Finished writing the buf at index req->write_index. */
        req->write_index++;

        assert((size_t)n >= len);
        n -= len;

        assert(stream->write_queue_size >= len);
        stream->write_queue_size -= len;

        if (req->write_index == req->nbufs) {
          /* Then we're done! */
          assert(n == 0);
          uv__write_req_finish(req);
          /* TODO: start trying to write the next request. */
          return;
        }
      }
    }
  }

  /* Either we've counted n down to zero or we've got EAGAIN. */
  assert(n == 0 || n == -1);

  /* Only non-blocking streams should use the write_watcher. */
  assert(!(stream->flags & UV_STREAM_BLOCKING));

  /* We're not done. */
  uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);

  /* Notify select() thread about state change */
  uv__stream_osx_interrupt_select(stream);
}